

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResultTable.cpp
# Opt level: O2

void __thiscall celero::ResultTable::add(ResultTable *this,shared_ptr<celero::ExperimentResult> *x)

{
  _Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
  _Var1;
  size_type sVar2;
  char cVar3;
  ostream *poVar4;
  Experiment *pEVar5;
  Statistics<long> *pSVar6;
  long lVar7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *entry;
  _Head_base<0UL,_celero::ResultTable::Impl_*,_false> _Var8;
  _Alloc_hider _Var9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  shared_ptr<celero::UserDefinedMeasurementCollector> udmCollector;
  string local_78;
  string local_58;
  __uniq_ptr_impl<celero::Experiment::Impl,_std::default_delete<celero::Experiment::Impl>_> local_38
  ;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  _Var8._M_head_impl =
       (this->pimpl)._pimpl._M_t.
       super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
       .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl;
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    if (*(char *)((long)_Var8._M_head_impl + 0x208) == '\0') {
      std::operator<<((ostream *)_Var8._M_head_impl,
                      "Group,Experiment,Problem Space,Samples,Iterations,Failure,");
      std::operator<<((ostream *)
                      (this->pimpl)._pimpl._M_t.
                      super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
                      .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>,
                      "Baseline,us/Iteration,Iterations/sec,");
      std::operator<<((ostream *)
                      (this->pimpl)._pimpl._M_t.
                      super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
                      .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>,
                      "T Min (us),T Mean (us),T Max (us),T Variance,T Standard Deviation,T Skewness,T Kurtosis,T Z Score,"
                     );
      std::operator<<((ostream *)
                      (this->pimpl)._pimpl._M_t.
                      super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
                      .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>,
                      "R Min (us),R Mean (us),R Max (us),R Variance,R Standard Deviation,R Skewness,R Kurtosis,R Z Score,"
                     );
      ExperimentResult::getUserDefinedMeasurements((ExperimentResult *)&local_58);
      UserDefinedMeasurementCollector::getAggregateValues_abi_cxx11_
                ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)&local_78,(UserDefinedMeasurementCollector *)local_58._M_dataplus._M_p);
      sVar2 = local_78._M_string_length;
      for (_Var9._M_p = local_78._M_dataplus._M_p; _Var9._M_p != (pointer)sVar2;
          _Var9._M_p = _Var9._M_p + 0x28) {
        poVar4 = std::operator<<((ostream *)
                                 (this->pimpl)._pimpl._M_t.
                                 super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
                                 .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>,
                                 (string *)_Var9._M_p);
        std::operator<<(poVar4,",");
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *)&local_78);
      std::endl<char,std::char_traits<char>>
                ((ostream *)
                 (this->pimpl)._pimpl._M_t.
                 super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
                 .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>);
      *(undefined1 *)
       ((long)(this->pimpl)._pimpl._M_t.
              super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
              .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false> + 0x208) = 1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
      _Var8._M_head_impl =
           (this->pimpl)._pimpl._M_t.
           super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
           .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl;
    }
    ExperimentResult::getExperiment
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    Experiment::getBenchmark((Experiment *)&local_38);
    Benchmark::getName_abi_cxx11_
              (&local_78,
               (Benchmark *)
               local_38._M_t.
               super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
               .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl);
    poVar4 = std::operator<<((ostream *)_Var8._M_head_impl,(string *)&local_78);
    poVar4 = std::operator<<(poVar4,",");
    pEVar5 = ExperimentResult::getExperiment
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    Experiment::getName_abi_cxx11_(&local_58,pEVar5);
    poVar4 = std::operator<<(poVar4,(string *)&local_58);
    poVar4 = std::operator<<(poVar4,",");
    ExperimentResult::getProblemSpaceValue
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4,",");
    pEVar5 = ExperimentResult::getExperiment
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    Experiment::getSamples(pEVar5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,",");
    ExperimentResult::getProblemSpaceIterations
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,",");
    ExperimentResult::getFailure
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::operator<<(poVar4,",");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    dVar10 = ExperimentResult::getBaselineMeasurement
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar4 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar4,",");
    dVar10 = ExperimentResult::getUsPerCall
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar4 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar4,",");
    dVar10 = ExperimentResult::getCallsPerSecond
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar4 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar4,",");
    _Var1.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl =
         (this->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
         .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>;
    ExperimentResult::getTimeStatistics
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar4 = std::ostream::_M_insert<long>
                       ((long)_Var1.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>.
                              _M_head_impl);
    std::operator<<(poVar4,",");
    pSVar6 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar4 = std::ostream::_M_insert<double>(pSVar6->M1);
    poVar4 = std::operator<<(poVar4,",");
    ExperimentResult::getTimeStatistics
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::operator<<(poVar4,",");
    pSVar6 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (pSVar6->sampleSize < 2) {
      dVar10 = 0.0;
    }
    else {
      lVar7 = pSVar6->sampleSize - 1;
      auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = 0x45300000;
      dVar10 = pSVar6->M2 /
               ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
    }
    poVar4 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar4,",");
    pSVar6 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    dVar10 = Statistics<long>::getStandardDeviation(pSVar6);
    poVar4 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar4,",");
    pSVar6 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    dVar10 = Statistics<long>::getSkewness(pSVar6);
    poVar4 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar4,",");
    pSVar6 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    dVar10 = Statistics<long>::getKurtosis(pSVar6);
    poVar4 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar4,",");
    pSVar6 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    dVar10 = Statistics<long>::getZScore(pSVar6);
    poVar4 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar4,",");
    _Var1.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl =
         (this->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
         .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>;
    ExperimentResult::getRAMStatistics
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar4 = std::ostream::_M_insert<long>
                       ((long)_Var1.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>.
                              _M_head_impl);
    std::operator<<(poVar4,",");
    pSVar6 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar4 = std::ostream::_M_insert<double>(pSVar6->M1);
    poVar4 = std::operator<<(poVar4,",");
    ExperimentResult::getRAMStatistics
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::operator<<(poVar4,",");
    pSVar6 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (pSVar6->sampleSize < 2) {
      dVar10 = 0.0;
    }
    else {
      lVar7 = pSVar6->sampleSize - 1;
      auVar12._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar12._0_8_ = lVar7;
      auVar12._12_4_ = 0x45300000;
      dVar10 = pSVar6->M2 /
               ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
    }
    poVar4 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar4,",");
    pSVar6 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    dVar10 = Statistics<long>::getStandardDeviation(pSVar6);
    poVar4 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar4,",");
    pSVar6 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    dVar10 = Statistics<long>::getSkewness(pSVar6);
    poVar4 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar4,",");
    pSVar6 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    dVar10 = Statistics<long>::getKurtosis(pSVar6);
    poVar4 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar4,",");
    pSVar6 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    dVar10 = Statistics<long>::getZScore(pSVar6);
    poVar4 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar4,",");
    ExperimentResult::getUserDefinedMeasurements((ExperimentResult *)&local_58);
    UserDefinedMeasurementCollector::getAggregateValues_abi_cxx11_
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)&local_78,(UserDefinedMeasurementCollector *)local_58._M_dataplus._M_p);
    for (_Var9._M_p = local_78._M_dataplus._M_p; _Var9._M_p != (pointer)local_78._M_string_length;
        _Var9._M_p = _Var9._M_p + 0x28) {
      poVar4 = std::ostream::_M_insert<double>(*(double *)((string *)_Var9._M_p + 0x20));
      std::operator<<(poVar4,",");
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *)&local_78);
    std::endl<char,std::char_traits<char>>
              ((ostream *)
               (this->pimpl)._pimpl._M_t.
               super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
               .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
  }
  return;
}

Assistant:

void ResultTable::add(std::shared_ptr<celero::ExperimentResult> x)
{
	if(this->pimpl->ofs.is_open() == true)
	{
		if(this->pimpl->hasWrittenHeader == false)
		{
			// Print the header for the table.
			this->pimpl->ofs << "Group,Experiment,Problem Space,Samples,Iterations,Failure,";

			this->pimpl->ofs << "Baseline,us/Iteration,Iterations/sec,";

			this->pimpl->ofs << "T Min (us),T Mean (us),T Max (us),T Variance,T Standard Deviation,T Skewness,T Kurtosis,T Z Score,";
			this->pimpl->ofs << "R Min (us),R Mean (us),R Max (us),R Variance,R Standard Deviation,R Skewness,R Kurtosis,R Z Score,";

			// User Defined Metrics
			const auto udmCollector = x->getUserDefinedMeasurements();
			for(const auto& entry : udmCollector->getAggregateValues())
			{
				this->pimpl->ofs << entry.first << ",";
			}

			// Purposefully flushing the buffer here.
			this->pimpl->ofs << std::endl;

			this->pimpl->hasWrittenHeader = true;
		}

		// Description
		this->pimpl->ofs << x->getExperiment()->getBenchmark()->getName() << "," << x->getExperiment()->getName() << "," << x->getProblemSpaceValue()
						 << "," << x->getExperiment()->getSamples() << "," << x->getProblemSpaceIterations() << "," << x->getFailure() << ",";

		// Measurements
		this->pimpl->ofs << x->getBaselineMeasurement() << "," << x->getUsPerCall() << "," << x->getCallsPerSecond() << ",";

		// Statistics
		this->pimpl->ofs << x->getTimeStatistics().getMin() << "," << x->getTimeStatistics().getMean() << "," << x->getTimeStatistics().getMax()
						 << "," << x->getTimeStatistics().getVariance() << "," << x->getTimeStatistics().getStandardDeviation() << ","
						 << x->getTimeStatistics().getSkewness() << "," << x->getTimeStatistics().getKurtosis() << ","
						 << x->getTimeStatistics().getZScore() << ",";

		// Statistics
		this->pimpl->ofs << x->getRAMStatistics().getMin() << "," << x->getRAMStatistics().getMean() << "," << x->getRAMStatistics().getMax() << ","
						 << x->getRAMStatistics().getVariance() << "," << x->getRAMStatistics().getStandardDeviation() << ","
						 << x->getRAMStatistics().getSkewness() << "," << x->getRAMStatistics().getKurtosis() << ","
						 << x->getRAMStatistics().getZScore() << ",";

		// User Defined Metrics
		const auto udmCollector = x->getUserDefinedMeasurements();
		for(const auto& entry : udmCollector->getAggregateValues())
		{
			this->pimpl->ofs << entry.second << ",";
		}

		// Purposefully flushing the buffer here.
		this->pimpl->ofs << std::endl;
	}
}